

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDReplace
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,SIMDReplace *curr)

{
  Expression **ppEVar1;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  SIMDReplace *local_18;
  SIMDReplace *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  local_18 = curr;
  curr_local = (SIMDReplace *)this;
  wasm::Type::Type(&local_20,v128);
  note(this,&curr->vec,local_20);
  switch(local_18->op) {
  case ReplaceLaneVecI8x16:
  case ReplaceLaneVecI16x8:
  case ReplaceLaneVecI32x4:
    ppEVar1 = &local_18->value;
    wasm::Type::Type(&local_28,i32);
    note(this,ppEVar1,local_28);
    break;
  case ReplaceLaneVecI64x2:
    ppEVar1 = &local_18->value;
    wasm::Type::Type(&local_30,i64);
    note(this,ppEVar1,local_30);
    break;
  case ReplaceLaneVecF16x8:
  case ReplaceLaneVecF32x4:
    ppEVar1 = &local_18->value;
    wasm::Type::Type(&local_38,f32);
    note(this,ppEVar1,local_38);
    break;
  case ReplaceLaneVecF64x2:
    ppEVar1 = &local_18->value;
    wasm::Type::Type(&local_40,f64);
    note(this,ppEVar1,local_40);
  }
  return;
}

Assistant:

void visitSIMDReplace(SIMDReplace* curr) {
    note(&curr->vec, Type::v128);
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
      case ReplaceLaneVecI16x8:
      case ReplaceLaneVecI32x4:
        note(&curr->value, Type::i32);
        break;
      case ReplaceLaneVecI64x2:
        note(&curr->value, Type::i64);
        break;
      case ReplaceLaneVecF16x8:
      case ReplaceLaneVecF32x4:
        note(&curr->value, Type::f32);
        break;
      case ReplaceLaneVecF64x2:
        note(&curr->value, Type::f64);
        break;
    }
  }